

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::anon_unknown_15::writer_some::operator()(writer_some *this,error_code *e)

{
  bool bVar1;
  size_t sVar2;
  error_code *in_RSI;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some> *in_RDI;
  size_t n;
  error_code err;
  event_handler *in_stack_ffffffffffffff98;
  error_code *in_stack_ffffffffffffffa0;
  writer_some *this_00;
  error_code *in_stack_ffffffffffffffb8;
  const_buffer *in_stack_ffffffffffffffc0;
  stream_socket *in_stack_ffffffffffffffc8;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(unsigned_long)in_RDI);
  }
  else {
    std::error_code::error_code(in_stack_ffffffffffffffa0);
    sVar2 = stream_socket::write_some
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
    if (((sVar2 == 0) &&
        (bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0),
        bVar1)) && (bVar1 = basic_io_device::would_block(in_stack_ffffffffffffffa0), bVar1)) {
      this_00 = in_RDI[9].p_;
      intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some>::intrusive_ptr
                (in_RDI,(writer_some *)&stack0xffffffffffffffc8,SUB81((ulong)this_00 >> 0x38,0));
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::writer_some>
                ((callback<void_(const_std::error_code_&)> *)this_00,
                 (intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some> *)
                 in_stack_ffffffffffffff98);
      basic_io_device::on_writeable((basic_io_device *)this_00,in_stack_ffffffffffffff98);
      callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x21b85a);
      intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some>::~intrusive_ptr
                ((intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some> *)this_00);
    }
    else {
      callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(unsigned_long)in_RDI);
    }
  }
  return;
}

Assistant:

void operator()(system::error_code const &e) 
		{
			if(e) {
				h(e,0);
			}
			else {
				system::error_code err;
				size_t n=sock->write_some(buf,err);
				if(n==0 && err && basic_io_device::would_block(err))
					sock->on_writeable(pointer(this)); 
				else
					h(err,n);
			}
		}